

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_cmi(inform_dist *joint,inform_dist *marginal_xz,inform_dist *marginal_yz,
                         inform_dist *marginal_z,double base)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double base_local;
  inform_dist *marginal_z_local;
  inform_dist *marginal_yz_local;
  inform_dist *marginal_xz_local;
  inform_dist *joint_local;
  
  dVar1 = inform_shannon_entropy(marginal_xz,base);
  dVar2 = inform_shannon_entropy(marginal_yz,base);
  dVar3 = inform_shannon_entropy(joint,base);
  dVar4 = inform_shannon_entropy(marginal_z,base);
  return ((dVar1 + dVar2) - dVar3) - dVar4;
}

Assistant:

double inform_shannon_cmi(inform_dist const *joint,
    inform_dist const *marginal_xz, inform_dist const *marginal_yz,
    inform_dist const *marginal_z, double base)
{
    return inform_shannon_entropy(marginal_xz, base) +
        inform_shannon_entropy(marginal_yz, base) -
        inform_shannon_entropy(joint, base) -
        inform_shannon_entropy(marginal_z, base);
}